

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,pair<int,_char> *args,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
          *args_1)

{
  ulong minQueueCapacity;
  QueueWriter *this_00;
  char **ppcVar1;
  char *pcVar2;
  Queue *pQVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t sizes [4];
  long local_78 [7];
  long local_40;
  
  local_78[4] = 8;
  local_78[5] = 8;
  local_78[0] = 0;
  local_78[1] = 4;
  local_78[2] = 1;
  local_78[6] = 0;
  lVar5 = 0;
  do {
    local_78[6] = local_78[6] + *(long *)((long)local_78 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  local_78[0] = 0;
  local_78[1] = (args_1->
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                ).
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_string_length + 4;
  local_78[2] = 1;
  local_78[3] = 4;
  lVar6 = 0;
  lVar7 = 0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + local_78[lVar5];
    lVar7 = lVar7 + local_78[lVar5 + 1];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  local_40 = lVar7 + lVar6;
  lVar6 = 0;
  lVar7 = 0;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + local_78[lVar5 + 4];
    lVar7 = lVar7 + local_78[lVar5 + 5];
    lVar5 = lVar5 + 2;
  } while (lVar5 != 4);
  minQueueCapacity = lVar7 + lVar6 + 4;
  this_00 = &this->_qw;
  if (((((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < minQueueCapacity)) &&
      (replaceChannel(this,minQueueCapacity),
      (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
     (sVar4 = detail::QueueWriter::maximizeWriteCapacity(this_00), sVar4 < minQueueCapacity)) {
    return false;
  }
  *(int *)(this->_qw)._writePos = (int)(lVar7 + lVar6);
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 4;
  *(uint64_t *)(pcVar2 + 4) = eventSourceId;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 8;
  *(uint64_t *)(pcVar2 + 8) = clock;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 8;
  *(int *)(pcVar2 + 8) = args->first;
  pcVar2 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar2 + 4;
  pcVar2[4] = args->second;
  ppcVar1 = &(this->_qw)._writePos;
  *ppcVar1 = *ppcVar1 + 1;
  mserialize::detail::BuiltinSerializer<std::tuple<std::__cxx11::string,bool,int>,void>::
  serialize_elems<binlog::detail::QueueWriter,0ul,1ul,2ul>(args_1,this_00);
  pQVar3 = (this->_qw)._queue;
  (pQVar3->writeIndex).super___atomic_base<unsigned_long>._M_i =
       (long)(this->_qw)._writePos - (long)pQVar3->buffer;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}